

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

RawSchema ** __thiscall
capnp::SchemaLoader::Validator::makeDependencyArray(Validator *this,uint32_t *count)

{
  RawSchema *pRVar1;
  bool bVar2;
  size_t sVar3;
  RawSchema **ppRVar4;
  ulong index;
  Fault local_b8;
  Fault f;
  undefined1 local_a8 [8];
  DebugComparison<unsigned_int_&,_unsigned_int_&> _kjCondition;
  Entry *dep;
  Iterator __end2;
  Iterator __begin2;
  TreeMap<unsigned_long,_capnp::_::RawSchema_*> *__range2;
  undefined1 auStack_28 [4];
  uint pos;
  ArrayPtr<const_capnp::_::RawSchema_*> result;
  uint32_t *count_local;
  Validator *this_local;
  
  result.size_ = (size_t)count;
  sVar3 = kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::size(&this->dependencies);
  *(int *)result.size_ = (int)sVar3;
  _auStack_28 = kj::Arena::allocateArray<capnp::_::RawSchema_const*>
                          (&this->loader->arena,(ulong)*(uint *)result.size_);
  __range2._4_4_ = 0;
  kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::begin
            ((Iterator *)&__end2.inner.row,&this->dependencies);
  kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::end((Iterator *)&dep,&this->dependencies);
  while( true ) {
    bVar2 = kj::
            MappedIterator<kj::_::BTreeImpl::Iterator,_kj::_::TableMapping<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry>_>
            ::operator==((MappedIterator<kj::_::BTreeImpl::Iterator,_kj::_::TableMapping<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry>_>
                          *)&__end2.inner.row,
                         (MappedIterator<kj::_::BTreeImpl::Iterator,_kj::_::TableMapping<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry>_>
                          *)&dep);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    _kjCondition._32_8_ =
         kj::
         MappedIterator<kj::_::BTreeImpl::Iterator,_kj::_::TableMapping<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry>_>
         ::operator*((MappedIterator<kj::_::BTreeImpl::Iterator,_kj::_::TableMapping<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry>_>
                      *)&__end2.inner.row);
    pRVar1 = ((Entry *)_kjCondition._32_8_)->value;
    index = (ulong)__range2._4_4_;
    __range2._4_4_ = __range2._4_4_ + 1;
    ppRVar4 = kj::ArrayPtr<const_capnp::_::RawSchema_*>::operator[]
                        ((ArrayPtr<const_capnp::_::RawSchema_*> *)auStack_28,index);
    *ppRVar4 = pRVar1;
    kj::
    MappedIterator<kj::_::BTreeImpl::Iterator,_kj::_::TableMapping<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry>_>
    ::operator++((MappedIterator<kj::_::BTreeImpl::Iterator,_kj::_::TableMapping<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry>_>
                  *)&__end2.inner.row);
  }
  f.exception = (Exception *)
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                           (uint *)((long)&__range2 + 4));
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_unsigned_int_&> *)local_a8,
             (DebugExpression<unsigned_int&> *)&f,(uint *)result.size_);
  bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a8);
  if (!bVar2) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int&>&>
              (&local_b8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x10a,FAILED,"pos == *count","_kjCondition,",
               (DebugComparison<unsigned_int_&,_unsigned_int_&> *)local_a8);
    kj::_::Debug::Fault::fatal(&local_b8);
  }
  ppRVar4 = kj::ArrayPtr<const_capnp::_::RawSchema_*>::begin
                      ((ArrayPtr<const_capnp::_::RawSchema_*> *)auStack_28);
  return ppRVar4;
}

Assistant:

const _::RawSchema** makeDependencyArray(uint32_t* count) {
    *count = dependencies.size();
    kj::ArrayPtr<const _::RawSchema*> result =
        loader.arena.allocateArray<const _::RawSchema*>(*count);
    uint pos = 0;
    for (auto& dep: dependencies) {
      result[pos++] = dep.value;
    }
    KJ_DASSERT(pos == *count);
    return result.begin();
  }